

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall
embree::TutorialApplication::compareToReferenceImage(TutorialApplication *this,FileName *fileName)

{
  uint uVar1;
  Col4<unsigned_char> *color;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  runtime_error *this_01;
  uint i;
  uint uVar2;
  TutorialApplication *this_02;
  double __val;
  Ref<embree::Image> local_c0;
  Ref<embree::Image> local_b8;
  Ref<embree::Image> reference;
  string local_a8;
  string local_88;
  ISPCCamera ispccamera;
  
  resize(this,this->width,this->height);
  this_02 = (TutorialApplication *)&ispccamera;
  Camera::getISPCCamera
            ((ISPCCamera *)&ispccamera,&this->camera,(ulong)this->width,(ulong)this->height);
  initRayStats(this_02);
  for (uVar2 = 0; uVar2 < this->numFrames; uVar2 = uVar2 + 1) {
    (*(this->super_Application)._vptr_Application[0xb])
              ((ulong)(uint)this->render_time,this,this->pixels,(ulong)this->width,
               (ulong)this->height,(TutorialApplication *)&ispccamera);
  }
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)::operator_new(0x48);
  uVar2 = this->width;
  uVar1 = this->height;
  color = (Col4<unsigned_char> *)this->pixels;
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_88);
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (this_00,(ulong)uVar2,(ulong)uVar1,color,true,&local_a8,false);
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)&local_a8);
  loadImage((embree *)&reference,fileName,false);
  local_b8.ptr = (Image *)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  local_c0.ptr = reference.ptr;
  if (reference.ptr != (Image *)0x0) {
    (*((reference.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  __val = compareImages(&local_b8,&local_c0);
  if (local_c0.ptr != (Image *)0x0) {
    (*((local_c0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((ImageT<embree::Col4<unsigned_char>_> *)local_b8.ptr !=
      (ImageT<embree::Col4<unsigned_char>_> *)0x0) {
    (*(((Image *)&(local_b8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if (__val <= (double)this->referenceImageThreshold) {
    if (reference.ptr != (Image *)0x0) {
      (*((reference.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    (*(this_00->super_Image).super_RefCount._vptr_RefCount[3])(this_00);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_88,__val);
  std::operator+(&local_a8,"reference image differs by ",&local_88);
  std::runtime_error::runtime_error(this_01,(string *)&local_a8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TutorialApplication::compareToReferenceImage(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);

    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    Ref<Image> reference = loadImage(fileName);
    const double error = compareImages(image,reference);
    if (error > referenceImageThreshold) // error corresponds roughly to number of pixels that are completely off in color
      throw std::runtime_error("reference image differs by " + std::to_string(error));
  }